

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O1

unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_> __thiscall
async_simple::coro::detail::
LazyAwaiterBase<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
::awaitResume(LazyAwaiterBase<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
              *this)

{
  unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_> *puVar1;
  long *in_RSI;
  unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_> r;
  _Head_base<0UL,_cinatra::coro_http_client_*,_false> local_18;
  
  puVar1 = LazyPromise<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
           ::result((LazyPromise<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
                     *)(*in_RSI + 0x10));
  local_18._M_head_impl =
       (puVar1->_M_t).
       super___uniq_ptr_impl<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
       ._M_t.
       super__Tuple_impl<0UL,_cinatra::coro_http_client_*,_std::default_delete<cinatra::coro_http_client>_>
       .super__Head_base<0UL,_cinatra::coro_http_client_*,_false>._M_head_impl;
  (puVar1->_M_t).
  super___uniq_ptr_impl<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>.
  _M_t.
  super__Tuple_impl<0UL,_cinatra::coro_http_client_*,_std::default_delete<cinatra::coro_http_client>_>
  .super__Head_base<0UL,_cinatra::coro_http_client_*,_false>._M_head_impl = (coro_http_client *)0x0;
  (**(code **)(*in_RSI + 8))();
  *in_RSI = 0;
  (this->_handle).__handle_ = local_18._M_head_impl;
  local_18._M_head_impl = (coro_http_client *)0x0;
  std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
  ~unique_ptr((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
               *)&local_18);
  return (__uniq_ptr_data<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>,_true,_true>
          )(__uniq_ptr_data<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>,_true,_true>
            )this;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }